

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserMetadata.cpp
# Opt level: O0

void __thiscall
slang::parsing::anon_unknown_4::MetadataVisitor::visitToken(MetadataVisitor *this,Token token)

{
  _Optional_payload<slang::TimeScale,_true,_true,_true> *p_Var1;
  undefined1 uVar2;
  bool bVar3;
  optional<slang::TimeScaleValue> oVar4;
  reference pTVar5;
  DefaultNetTypeDirectiveSyntax *pDVar6;
  UnconnectedDriveDirectiveSyntax *pUVar7;
  TimeScaleValue *pTVar8;
  optional<slang::TimeScale> *in_RDI;
  optional<slang::TimeScaleValue> prec;
  optional<slang::TimeScaleValue> unit;
  TimeScaleDirectiveSyntax *tsd;
  SyntaxNode *s;
  Trivia t;
  iterator __end3;
  iterator __begin3;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> *__range3;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> *in_stack_ffffffffffffff68;
  Token *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  SyntaxKind SVar9;
  undefined4 local_75;
  TimeScaleMagnitude local_71;
  undefined2 in_stack_ffffffffffffff90;
  undefined2 in_stack_ffffffffffffff92;
  TimeScaleValue base;
  TimeScale in_stack_ffffffffffffff94;
  NumericTokenFlags local_68;
  _Storage<slang::TimeScaleValue,_true> local_67;
  undefined1 local_65;
  NumericTokenFlags local_64;
  _Storage<slang::TimeScaleValue,_true> local_63;
  undefined1 local_61;
  TimeScaleDirectiveSyntax *local_60;
  SyntaxNode *local_58;
  anon_union_12_4_39e54f29_for_Trivia_0 local_50;
  TriviaKind TStack_43;
  Trivia *local_40;
  __normal_iterator<const_slang::parsing::Trivia_*,_std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
  local_38;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> local_30;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> *local_20;
  
  local_30 = Token::trivia((Token *)CONCAT44(in_stack_ffffffffffffff94,
                                             CONCAT22(in_stack_ffffffffffffff92,
                                                      in_stack_ffffffffffffff90)));
  local_20 = &local_30;
  local_38._M_current =
       (Trivia *)
       std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::begin
                 (in_stack_ffffffffffffff68);
  local_40 = (Trivia *)
             std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::end
                       ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)
                        CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  while (bVar3 = __gnu_cxx::
                 operator==<const_slang::parsing::Trivia_*,_std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
                           ((__normal_iterator<const_slang::parsing::Trivia_*,_std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
                             *)in_stack_ffffffffffffff70,
                            (__normal_iterator<const_slang::parsing::Trivia_*,_std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
                             *)in_stack_ffffffffffffff68), ((bVar3 ^ 0xffU) & 1) != 0) {
    pTVar5 = __gnu_cxx::
             __normal_iterator<const_slang::parsing::Trivia_*,_std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
             ::operator*(&local_38);
    local_50.rawText.ptr = (pTVar5->field_0).rawText.ptr;
    unique0x00012000 = *(undefined8 *)((long)&pTVar5->field_0 + 8);
    if (TStack_43 == Directive) {
      local_58 = Trivia::syntax((Trivia *)&local_50);
      SVar9 = local_58->kind;
      if (SVar9 == CellDefineDirective) {
        in_RDI[0x57].super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
        super__Optional_payload_base<slang::TimeScale>._M_payload._M_value.base.magnitude = One;
      }
      else if (SVar9 == DefaultNetTypeDirective) {
        pDVar6 = slang::syntax::SyntaxNode::as<slang::syntax::DefaultNetTypeDirectiveSyntax>
                           (local_58);
        uVar2 = *(undefined1 *)((long)&(pDVar6->netType).kind + 1);
        p_Var1 = &in_RDI[0x56].super__Optional_base<slang::TimeScale,_true,_true>._M_payload;
        *(undefined1 *)
         ((long)&(p_Var1->super__Optional_payload_base<slang::TimeScale>)._M_payload + 2) =
             *(undefined1 *)&(pDVar6->netType).kind;
        *(undefined1 *)
         ((long)&(p_Var1->super__Optional_payload_base<slang::TimeScale>)._M_payload + 3) = uVar2;
        if (in_RDI[0x56].super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
            super__Optional_payload_base<slang::TimeScale>._M_payload._M_value.precision ==
            (TimeScaleValue)0x2) {
          p_Var1 = &in_RDI[0x56].super__Optional_base<slang::TimeScale,_true,_true>._M_payload;
          *(TimeUnit *)
           ((long)&(p_Var1->super__Optional_payload_base<slang::TimeScale>)._M_payload + 2) =
               Seconds;
          *(TimeScaleMagnitude *)
           ((long)&(p_Var1->super__Optional_payload_base<slang::TimeScale>)._M_payload + 3) = 0;
        }
      }
      else if (SVar9 == EndCellDefineDirective) {
        in_RDI[0x57].super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
        super__Optional_payload_base<slang::TimeScale>._M_payload._M_value.base.magnitude = 0;
      }
      else if (SVar9 == NoUnconnectedDriveDirective) {
        *(undefined2 *)
         &in_RDI[0x56].super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
          super__Optional_payload_base<slang::TimeScale>._M_engaged = 0;
      }
      else if (SVar9 == ResetAllDirective) {
        p_Var1 = &in_RDI[0x56].super__Optional_base<slang::TimeScale,_true,_true>._M_payload;
        *(TimeUnit *)
         ((long)&(p_Var1->super__Optional_payload_base<slang::TimeScale>)._M_payload + 2) = Seconds;
        *(TimeScaleMagnitude *)
         ((long)&(p_Var1->super__Optional_payload_base<slang::TimeScale>)._M_payload + 3) = 0;
        *(undefined2 *)
         &in_RDI[0x56].super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
          super__Optional_payload_base<slang::TimeScale>._M_engaged = 0;
        in_RDI[0x57].super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
        super__Optional_payload_base<slang::TimeScale>._M_payload._M_value.base.magnitude = 0;
        std::optional<slang::TimeScale>::optional((optional<slang::TimeScale> *)0x8e9eb6);
        *(undefined4 *)
         ((long)&in_RDI[0x57].super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
                 super__Optional_payload_base<slang::TimeScale>._M_payload + 2) = local_75;
        in_RDI[0x58].super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
        super__Optional_payload_base<slang::TimeScale>._M_payload._M_value.base.magnitude = local_71
        ;
      }
      else if (SVar9 == TimeScaleDirective) {
        local_60 = slang::syntax::SyntaxNode::as<slang::syntax::TimeScaleDirectiveSyntax>(local_58);
        if (((local_60->timeUnit).kind == TimeLiteral) &&
           ((local_60->timePrecision).kind == TimeLiteral)) {
          in_stack_ffffffffffffff68 =
               (span<const_slang::parsing::Trivia,_18446744073709551615UL> *)
               Token::realValue(in_stack_ffffffffffffff70);
          local_64 = Token::numericFlags(&local_60->timeUnit);
          NumericTokenFlags::unit(&local_64);
          oVar4 = TimeScaleValue::fromLiteral
                            ((double)CONCAT44(SVar9,in_stack_ffffffffffffff78),
                             (TimeUnit)((ulong)in_stack_ffffffffffffff70 >> 0x38));
          local_63 = oVar4.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
                     super__Optional_payload_base<slang::TimeScaleValue>._M_payload;
          local_61 = oVar4.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
                     super__Optional_payload_base<slang::TimeScaleValue>._M_engaged;
          in_stack_ffffffffffffff70 = (Token *)Token::realValue(in_stack_ffffffffffffff70);
          local_68 = Token::numericFlags(&local_60->timePrecision);
          NumericTokenFlags::unit(&local_68);
          oVar4 = TimeScaleValue::fromLiteral
                            ((double)CONCAT44(SVar9,in_stack_ffffffffffffff78),
                             (TimeUnit)((ulong)in_stack_ffffffffffffff70 >> 0x38));
          local_67 = oVar4.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
                     super__Optional_payload_base<slang::TimeScaleValue>._M_payload;
          local_65 = oVar4.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
                     super__Optional_payload_base<slang::TimeScaleValue>._M_engaged;
          bVar3 = std::optional::operator_cast_to_bool((optional<slang::TimeScaleValue> *)0x8e9e23);
          if ((bVar3) &&
             (bVar3 = std::optional::operator_cast_to_bool
                                ((optional<slang::TimeScaleValue> *)0x8e9e33), bVar3)) {
            pTVar8 = std::optional<slang::TimeScaleValue>::operator*
                               ((optional<slang::TimeScaleValue> *)0x8e9e43);
            base = *pTVar8;
            pTVar8 = std::optional<slang::TimeScaleValue>::operator*
                               ((optional<slang::TimeScaleValue> *)0x8e9e55);
            TimeScale::TimeScale((TimeScale *)&stack0xffffffffffffff94,base,*pTVar8);
            std::optional<slang::TimeScale>::operator=
                      (in_RDI,(TimeScale *)CONCAT44(SVar9,in_stack_ffffffffffffff78));
          }
        }
      }
      else if (SVar9 == UnconnectedDriveDirective) {
        pUVar7 = slang::syntax::SyntaxNode::as<slang::syntax::UnconnectedDriveDirectiveSyntax>
                           (local_58);
        *(TokenKind *)
         &in_RDI[0x56].super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
          super__Optional_payload_base<slang::TimeScale>._M_engaged = (pUVar7->strength).kind;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_slang::parsing::Trivia_*,_std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
    ::operator++(&local_38);
  }
  return;
}

Assistant:

void visitToken(Token token) {
        // Look through the token's trivia for any preprocessor directives
        // that might need to be captured in the metadata for module decls.
        for (auto t : token.trivia()) {
            if (t.kind == TriviaKind::Directive) {
                auto s = t.syntax();
                switch (s->kind) {
                    case SyntaxKind::DefaultNetTypeDirective:
                        defaultNetType = s->as<DefaultNetTypeDirectiveSyntax>().netType.kind;
                        if (defaultNetType == TokenKind::Identifier)
                            defaultNetType = TokenKind::Unknown;
                        break;
                    case SyntaxKind::UnconnectedDriveDirective:
                        unconnectedDrive = s->as<UnconnectedDriveDirectiveSyntax>().strength.kind;
                        break;
                    case SyntaxKind::NoUnconnectedDriveDirective:
                        unconnectedDrive = TokenKind::Unknown;
                        break;
                    case SyntaxKind::CellDefineDirective:
                        cellDefine = true;
                        break;
                    case SyntaxKind::EndCellDefineDirective:
                        cellDefine = false;
                        break;
                    case SyntaxKind::TimeScaleDirective: {
                        auto& tsd = s->as<TimeScaleDirectiveSyntax>();
                        if (tsd.timeUnit.kind == TokenKind::TimeLiteral &&
                            tsd.timePrecision.kind == TokenKind::TimeLiteral) {
                            auto unit = TimeScaleValue::fromLiteral(
                                tsd.timeUnit.realValue(), tsd.timeUnit.numericFlags().unit());
                            auto prec = TimeScaleValue::fromLiteral(
                                tsd.timePrecision.realValue(),
                                tsd.timePrecision.numericFlags().unit());

                            if (unit && prec)
                                timeScale = {*unit, *prec};
                        }
                        break;
                    }
                    case SyntaxKind::ResetAllDirective:
                        defaultNetType = TokenKind::Unknown;
                        unconnectedDrive = TokenKind::Unknown;
                        cellDefine = false;
                        timeScale = {};
                        break;
                    default:
                        break;
                }
            }
        }
    }